

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5VtoVDelete(Fts5Tokenizer *pTok)

{
  if (pTok != (Fts5Tokenizer *)0x0) {
    (**(code **)(pTok + (ulong)(*(int *)pTok != 0) * 0x20 + 0x10))(*(undefined8 *)(pTok + 0x40));
    sqlite3_free(pTok);
    return;
  }
  return;
}

Assistant:

static void fts5VtoVDelete(Fts5Tokenizer *pTok){
  Fts5VtoVTokenizer *p = (Fts5VtoVTokenizer*)pTok;
  if( p ){
    if( p->bV2Native ){
      p->x2.xDelete(p->pReal);
    }else{
      p->x1.xDelete(p->pReal);
    }
    sqlite3_free(p);
  }
}